

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::getFileList
          (Implement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rFileList)

{
  _Base_ptr p_Var1;
  
  MapArchive(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rFileList);
  for (p_Var1 = (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(rFileList,(value_type *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::getFileList(std::vector<std::string>& rFileList) {
        MapArchive();
        rFileList.clear();

        for (const auto &file : m_ArchiveMap) {
            rFileList.push_back(file.first);
        }
    }